

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall bloaty::DualMaps::ComputeRollup(DualMaps *this,Rollup *rollup)

{
  pointer puVar1;
  vector<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
  *__range2;
  unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_> *map;
  pointer puVar2;
  _Vector_base<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> _Stack_38;
  
  puVar1 = (this->maps_).
           super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->maps_).
                super__Vector_base<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>,_std::allocator<std::unique_ptr<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    RangeMap::Compress(&((puVar2->_M_t).
                         super___uniq_ptr_impl<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_bloaty::DualMap_*,_std::default_delete<bloaty::DualMap>_>
                         .super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl)->vm_map);
    RangeMap::Compress(&((puVar2->_M_t).
                         super___uniq_ptr_impl<bloaty::DualMap,_std::default_delete<bloaty::DualMap>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_bloaty::DualMap_*,_std::default_delete<bloaty::DualMap>_>
                         .super__Head_base<0UL,_bloaty::DualMap_*,_false>._M_head_impl)->file_map);
  }
  VmMaps((vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *)&_Stack_38,
         this);
  RangeMap::
  ComputeRollup<bloaty::DualMaps::ComputeRollup(bloaty::Rollup*)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_long,unsigned_long)_1_>
            ((vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *)
             &_Stack_38,(anon_class_8_1_69fb5516)rollup);
  std::_Vector_base<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_>::
  ~_Vector_base(&_Stack_38);
  FileMaps((vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *)&_Stack_38
           ,this);
  RangeMap::
  ComputeRollup<bloaty::DualMaps::ComputeRollup(bloaty::Rollup*)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,unsigned_long,unsigned_long)_2_>
            ((vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *)
             &_Stack_38,(anon_class_8_1_69fb5516)rollup);
  std::_Vector_base<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_>::
  ~_Vector_base(&_Stack_38);
  return;
}

Assistant:

void ComputeRollup(Rollup* rollup) {
    for (auto& map : maps_) {
      map->vm_map.Compress();
      map->file_map.Compress();
    }
    RangeMap::ComputeRollup(VmMaps(), [=](const std::vector<std::string>& keys,
                                          uint64_t addr, uint64_t end) {
      return rollup->AddSizes(keys, end - addr, true);
    });
    RangeMap::ComputeRollup(
        FileMaps(),
        [=](const std::vector<std::string>& keys, uint64_t addr, uint64_t end) {
          return rollup->AddSizes(keys, end - addr, false);
        });
  }